

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O0

TString * luaX_newstring(LexState *ls,char *str,size_t l)

{
  lua_State *L_00;
  StkId pTVar1;
  TValue *pTVar2;
  TValue *io_1;
  TString *x_;
  TValue *io;
  TString *ts;
  TValue *o;
  lua_State *L;
  size_t l_local;
  char *str_local;
  LexState *ls_local;
  
  L_00 = ls->L;
  io = (TValue *)luaS_newlstr(L_00,str,l);
  pTVar1 = L_00->top;
  L_00->top = pTVar1 + 1;
  (pTVar1->value_).gc = (GCObject *)io;
  pTVar1->tt_ = ((TString *)io)->tt | 0x40;
  pTVar2 = luaH_set(L_00,ls->h,L_00->top + -1);
  if (pTVar2->tt_ == 0) {
    (pTVar2->value_).b = 1;
    pTVar2->tt_ = 1;
    if (0 < L_00->l_G->GCdebt) {
      luaC_step(L_00);
    }
  }
  else {
    io = (TValue *)pTVar2[1].value_.gc;
  }
  L_00->top = L_00->top + -1;
  return (TString *)io;
}

Assistant:

TString *luaX_newstring (LexState *ls, const char *str, size_t l) {
  lua_State *L = ls->L;
  TValue *o;  /* entry for 'str' */
  TString *ts = luaS_newlstr(L, str, l);  /* create new string */
  setsvalue2s(L, L->top++, ts);  /* temporarily anchor it in stack */
  o = luaH_set(L, ls->h, L->top - 1);
  if (ttisnil(o)) {  /* not in use yet? */
    /* boolean value does not need GC barrier;
       table has no metatable, so it does not need to invalidate cache */
    setbvalue(o, 1);  /* t[string] = true */
    luaC_checkGC(L);
  }
  else {  /* string already present */
    ts = tsvalue(keyfromval(o));  /* re-use value previously stored */
  }
  L->top--;  /* remove string from stack */
  return ts;
}